

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O2

SRes LookToRead_Look_Lookahead(void *pp,void **buf,size_t *size)

{
  SRes SVar1;
  size_t sVar2;
  ulong local_28;
  
  SVar1 = 0;
  sVar2 = *size;
  local_28 = *(long *)((long)pp + 0x30) - *(long *)((long)pp + 0x28);
  if (local_28 == 0) {
    if (sVar2 == 0) {
      SVar1 = 0;
      goto LAB_0059d066;
    }
    *(undefined8 *)((long)pp + 0x28) = 0;
    local_28 = 0x4000;
    SVar1 = (*(code *)**(undefined8 **)((long)pp + 0x20))
                      (*(undefined8 **)((long)pp + 0x20),(long)pp + 0x38,&local_28);
    *(ulong *)((long)pp + 0x30) = local_28;
    sVar2 = *size;
  }
  if (local_28 < sVar2) {
    *size = local_28;
  }
LAB_0059d066:
  *buf = (void *)((long)pp + *(long *)((long)pp + 0x28) + 0x38);
  return SVar1;
}

Assistant:

static SRes LookToRead_Look_Lookahead(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    size2 = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, &size2);
    p->size = size2;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}